

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

bool __thiscall
flatbuffers::Parser::ParseFlexBuffer
          (Parser *this,char *source,char *source_filename,Builder *builder)

{
  int iVar1;
  bool bVar2;
  undefined8 in_RAX;
  undefined1 auStack_28 [6];
  char local_22;
  
  iVar1 = this->parse_depth_counter_;
  _auStack_28 = in_RAX;
  StartParseFile((Parser *)(auStack_28 + 6),(char *)this,source);
  if (local_22 != '\x01') {
    ParseFlexBufferValue((Parser *)(auStack_28 + 4),(Builder *)this);
    if (auStack_28[4] == '\0') {
      flexbuffers::Builder::Finish(builder);
      bVar2 = true;
      goto LAB_0011f56c;
    }
  }
  bVar2 = false;
LAB_0011f56c:
  if (iVar1 == this->parse_depth_counter_) {
    return bVar2;
  }
  __assert_fail("initial_depth == parse_depth_counter_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0xd83,
                "bool flatbuffers::Parser::ParseFlexBuffer(const char *, const char *, flexbuffers::Builder *)"
               );
}

Assistant:

bool Parser::ParseFlexBuffer(const char *source, const char *source_filename,
                             flexbuffers::Builder *builder) {
  const auto initial_depth = parse_depth_counter_;
  (void)initial_depth;
  auto ok = !StartParseFile(source, source_filename).Check() &&
            !ParseFlexBufferValue(builder).Check();
  if (ok) builder->Finish();
  FLATBUFFERS_ASSERT(initial_depth == parse_depth_counter_);
  return ok;
}